

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void aa1test(void)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  double *y;
  aa_ret_object obj;
  ulong uVar3;
  undefined1 local_25b8 [8];
  double temp [1200];
  int local_30 [2];
  int approx;
  int stepwise;
  
  local_30[0] = 0;
  local_30[1] = 0;
  __stream = fopen("../data/seriesB.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      iVar1 = 0;
      uVar3 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf \n",local_25b8 + uVar3);
        iVar2 = feof(__stream);
        uVar3 = uVar3 + 8;
        iVar1 = iVar1 + 1;
      } while (iVar2 == 0);
      y = (double *)malloc(uVar3 & 0x7fffffff8);
      memcpy(y,local_25b8,uVar3 & 0x7fffffff8);
    }
    else {
      iVar1 = 0;
      y = (double *)malloc(0);
    }
    obj = auto_arima1(y,iVar1,(int *)0x0,(int *)0x0,(int *)0x0,0,(int *)0x0,(int *)0x0,(int *)0x0,
                      (int *)0x0,(int *)0x0,"aicc",local_30 + 1,(int *)0x0,local_30,(int *)0x0,
                      (double *)0x0,0,"kpss","level",(double *)0x0,"seas",(double *)0x0,(int *)0x0,
                      (int *)0x0,0,(double *)0x0);
    aa_ret_summary(obj);
    free(y);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void aa1test() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	aa_ret_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	
	s = 0;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};
	const char *ic = "aicc";
	int approx = 0;
	int stepwise = 0;


	L = 0;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }


	//obj = sarimax_init(p, d, q, P, D, Q, s, r , N);
	//obj = myarima(inp,N,order,seasonal, constant, ic, trace, approx, offset,xreg, r, &rmethod) ;
	obj = auto_arima1(inp, N,NULL,NULL,NULL,s,NULL,NULL,NULL,NULL,NULL, ic, &stepwise,NULL,&approx,NULL,NULL,r, "kpss","level", NULL, "seas", NULL, NULL, NULL,0,NULL);

	aa_ret_summary(obj);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	//sarimax_setMethod(obj, 0); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	//sarimax_exec(obj, inp,xreg);
	

	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}